

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O1

void cppwinrt::get_interfaces_impl
               (writer *w,get_interfaces_t *result,bool defaulted,bool overridable,bool base,
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *generic_param_stack,
               pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> *children)

{
  table_base *ptVar1;
  undefined1 auVar2 [12];
  undefined8 uVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer pTVar6;
  table_base *ptVar7;
  interface_info *piVar8;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer args;
  bool bVar9;
  bool bVar10;
  CustomAttribute CVar11;
  TypeDef TVar12;
  TypeSpecSig type_signature;
  InterfaceImpl __begin1;
  GenericTypeInstSig signature;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  table<winmd::reader::TypeSpec> *local_188;
  undefined1 local_170 [32];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vStack_150;
  pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> local_138;
  vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_> local_118;
  InterfaceImpl local_f8;
  undefined4 local_e4;
  uint32_t local_e0;
  undefined4 local_dc;
  undefined1 local_d8 [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string_view local_88;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_38;
  
  local_e4 = (undefined4)CONCAT71(in_register_00000009,overridable);
  local_dc = (undefined4)CONCAT71(in_register_00000011,defaulted);
  local_f8.super_row_base<winmd::reader::InterfaceImpl>.m_table =
       (children->first).super_row_base<winmd::reader::InterfaceImpl>.m_table;
  uVar3._0_4_ = (children->first).super_row_base<winmd::reader::InterfaceImpl>.m_index;
  uVar3._4_4_ = *(undefined4 *)
                 &(children->first).super_row_base<winmd::reader::InterfaceImpl>.field_0xc;
  ptVar1 = (children->second).super_row_base<winmd::reader::InterfaceImpl>.m_table;
  local_e0 = (children->second).super_row_base<winmd::reader::InterfaceImpl>.m_index;
  if ((uint32_t)uVar3 != local_e0 ||
      local_f8.super_row_base<winmd::reader::InterfaceImpl>.m_table != ptVar1) {
    local_f8.super_row_base<winmd::reader::InterfaceImpl>._8_8_ = uVar3;
    local_98._8_8_ = result;
    local_38 = generic_param_stack;
    do {
      ptVar7 = local_f8.super_row_base<winmd::reader::InterfaceImpl>.m_table;
      local_170._0_8_ = (table_base *)0x0;
      local_170._8_4_ = 0;
      local_170[0x10] = false;
      local_170[0x11] = false;
      local_170[0x12] = false;
      local_170[0x13] = false;
      local_170[0x14] = false;
      local_170[0x15] = false;
      vStack_150.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_150.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_170._24_4_ = 0;
      local_170._28_4_ = 0;
      vStack_150.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98._M_allocated_capacity._0_4_ =
           winmd::reader::table_base::get_value<unsigned_int>
                     (local_f8.super_row_base<winmd::reader::InterfaceImpl>.m_table,(uint32_t)uVar3,
                      1);
      local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_table = (table_base *)0x1;
      local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_index = 0x1b48ef;
      local_138.first.super_row_base<winmd::reader::InterfaceImpl>._12_4_ = 0;
      local_d8._56_8_ = ptVar7;
      writer_base<cppwinrt::writer>::
      write_temp<winmd::reader::coded_index<winmd::reader::TypeDefOrRef>>
                (&local_78,&w->super_writer_base<cppwinrt::writer>,(string_view *)&local_138,
                 (coded_index<winmd::reader::TypeDefOrRef> *)(local_d8 + 0x38));
      local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_table = (table_base *)0x1b;
      local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_index = 0x1769ae;
      local_138.first.super_row_base<winmd::reader::InterfaceImpl>._12_4_ = 0;
      local_d8._0_8_ = (table_base *)0x10;
      local_d8._8_4_ = 0x1769ca;
      local_d8._12_4_ = 0;
      CVar11 = winmd::reader::get_attribute<winmd::reader::InterfaceImpl>
                         (&local_f8,(string_view *)&local_138,(string_view *)local_d8);
      bVar9 = CVar11.super_row_base<winmd::reader::CustomAttribute>.m_table != (table_base *)0x0;
      bVar10 = (char)local_dc != '\0';
      local_170[0x11] = !base && (bVar10 || bVar9);
      local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_table =
           (table_base *)local_78._M_string_length;
      local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_index =
           (uint32_t)local_78._M_dataplus._M_p;
      local_138.first.super_row_base<winmd::reader::InterfaceImpl>._12_4_ =
           SUB84((ulong)local_78._M_dataplus._M_p >> 0x20,0);
      local_170[0x10] = bVar9;
      piVar8 = find((get_interfaces_t *)local_98._8_8_,(string_view *)&local_138);
      if ((piVar8 == (interface_info *)0x0) ||
         ((piVar8->defaulted == false && (!base && (bVar10 || bVar9))))) {
        bVar9 = true;
        if ((char)local_e4 == '\0') {
          local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_table = (table_base *)0x1b;
          local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_index = 0x1769ae;
          local_138.first.super_row_base<winmd::reader::InterfaceImpl>._12_4_ = 0;
          local_d8._0_8_ = (table_base *)0x14;
          local_d8._8_4_ = 0x1769db;
          local_d8._12_4_ = 0;
          CVar11 = winmd::reader::get_attribute<winmd::reader::InterfaceImpl>
                             (&local_f8,(string_view *)&local_138,(string_view *)local_d8);
          bVar9 = CVar11.super_row_base<winmd::reader::CustomAttribute>.m_table != (table_base *)0x0
          ;
        }
        local_170[0x12] = bVar9;
        local_170[0x13] = base;
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator=(&vStack_150,local_38);
        switch(local_98._M_allocated_capacity._0_4_ & 3) {
        case 0:
          local_170._0_8_ = &(*(database **)local_d8._56_8_)->TypeDef;
          local_170._8_4_ = ((uint)local_98._M_allocated_capacity._0_4_ >> 2) - 1;
          break;
        case 1:
          local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_table =
               (table_base *)*(database **)local_d8._56_8_;
          local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_index =
               ((uint)local_98._M_allocated_capacity._0_4_ >> 2) - 1;
          TVar12 = winmd::reader::find_required((TypeRef *)&local_138);
          local_170._0_8_ = TVar12.super_row_base<winmd::reader::TypeDef>.m_table;
          local_170._8_4_ = TVar12.super_row_base<winmd::reader::TypeDef>.m_index;
          writer::add_depends(w,(TypeDef *)local_170);
          break;
        case 2:
          local_d8._0_8_ = &(*(database **)local_d8._56_8_)->TypeSpec;
          local_d8._8_4_ = ((uint)local_98._M_allocated_capacity._0_4_ >> 2) - 1;
          winmd::reader::TypeSpec::Signature((TypeSpecSig *)&local_138,(TypeSpec *)local_d8);
          pTVar6 = local_118.
                   super__Vector_base<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (args = local_118.
                      super__Vector_base<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>
                      ._M_impl.super__Vector_impl_data._M_start; args != pTVar6; args = args + 1) {
            local_88._M_len = 1;
            local_88._M_str = "%";
            writer_base<cppwinrt::writer>::write_temp<winmd::reader::TypeSig>
                      ((string *)local_d8,&w->super_writer_base<cppwinrt::writer>,&local_88,args);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
            if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
              operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
            }
          }
          std::
          vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      *)&vStack_150,&local_58);
          writer::push_generic_params((writer *)local_d8,(GenericTypeInstSig *)w);
          local_188 = (table<winmd::reader::TypeSpec> *)local_d8._0_8_;
          local_d8._16_4_ =
               (uint)local_138.second.super_row_base<winmd::reader::InterfaceImpl>.m_table;
          local_d8._20_4_ =
               local_138.second.super_row_base<winmd::reader::InterfaceImpl>.m_table._4_4_;
          local_d8._0_8_ = local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_table;
          local_d8._8_4_ = local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_index;
          local_d8._12_4_ = local_138.first.super_row_base<winmd::reader::InterfaceImpl>._12_4_;
          std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>::vector
                    ((vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_> *)
                     (local_d8 + 0x20),&local_118);
          if ((local_d8._16_4_ & 3) == 0) {
            auVar2._8_4_ = ((uint)local_d8._16_4_ >> 2) - 1;
            auVar2._0_8_ = *(size_t *)CONCAT44(local_d8._12_4_,local_d8._8_4_) + 0x78;
          }
          else if ((local_d8._16_4_ & 3) == 1) {
            local_88._M_len = *(size_t *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
            local_88._M_str =
                 (char *)CONCAT44(local_88._M_str._4_4_,((uint)local_d8._16_4_ >> 2) - 1);
            TVar12 = winmd::reader::find_required((TypeRef *)&local_88);
            auVar2 = TVar12.super_row_base<winmd::reader::TypeDef>._0_12_;
          }
          else {
            auVar2 = ZEXT412(0) << 0x40;
          }
          local_170._0_8_ = auVar2._0_8_;
          local_170._8_4_ = auVar2._8_4_;
          std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>::~vector
                    ((vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_> *)
                     (local_d8 + 0x20));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_58);
          std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>::~vector
                    (&local_118);
          goto LAB_0010f3c2;
        }
        local_188 = (table<winmd::reader::TypeSpec> *)0x0;
LAB_0010f3c2:
        local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_table = (table_base *)0x1b;
        local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_index = 0x1769ae;
        local_138.first.super_row_base<winmd::reader::InterfaceImpl>._12_4_ = 0;
        local_d8._0_8_ = (pointer)0x14;
        local_d8._8_4_ = 0x1769f0;
        local_d8._12_4_ = 0;
        CVar11 = winmd::reader::get_attribute<winmd::reader::TypeDef>
                           ((TypeDef *)local_170,(string_view *)&local_138,(string_view *)local_d8);
        bVar10 = local_170[0x12];
        bVar9 = local_170[0x11];
        local_170[0x14] =
             CVar11.super_row_base<winmd::reader::CustomAttribute>.m_table != (table_base *)0x0;
        local_d8._0_4_ = local_170._8_4_ + 1;
        winmd::reader::
        equal_range<winmd::reader::table<winmd::reader::InterfaceImpl>,unsigned_int,winmd::reader::TypeDef::InterfaceImpl()const::compare>
                  (&local_138,(reader *)&(*(database **)local_170._0_8_)->InterfaceImpl,
                   (writer *)local_d8);
        uVar3 = local_98._8_8_;
        get_interfaces_impl(w,(get_interfaces_t *)local_98._8_8_,bVar9,bVar10,base,&vStack_150,
                            &local_138);
        local_d8._0_8_ = local_78._M_string_length;
        local_d8._8_4_ = SUB84(local_78._M_dataplus._M_p,0);
        local_d8._12_4_ = (undefined4)((ulong)local_78._M_dataplus._M_p >> 0x20);
        piVar8 = find((get_interfaces_t *)uVar3,(string_view *)local_d8);
        if (piVar8 == (interface_info *)0x0) {
          std::
          vector<std::pair<std::__cxx11::string,cppwinrt::interface_info>,std::allocator<std::pair<std::__cxx11::string,cppwinrt::interface_info>>>
          ::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>const&,cppwinrt::interface_info>
                    ((vector<std::pair<std::__cxx11::string,cppwinrt::interface_info>,std::allocator<std::pair<std::__cxx11::string,cppwinrt::interface_info>>>
                      *)uVar3,(basic_string_view<char,_std::char_traits<char>_> *)local_d8,
                     (interface_info *)local_170);
        }
        else {
          *(ulong *)&(piVar8->type).super_row_base<winmd::reader::TypeDef>.field_0xe =
               CONCAT17(local_170[0x15],
                        CONCAT16(local_170[0x14],
                                 CONCAT15(local_170[0x13],
                                          CONCAT14(local_170[0x12],
                                                   CONCAT13(local_170[0x11],
                                                            CONCAT12(local_170[0x10],
                                                                     local_170._14_2_))))));
          (piVar8->type).super_row_base<winmd::reader::TypeDef>.m_table =
               (table_base *)local_170._0_8_;
          *(ulong *)&(piVar8->type).super_row_base<winmd::reader::TypeDef>.m_index =
               CONCAT26(local_170._14_2_,CONCAT24(local_170._12_2_,local_170._8_4_));
          (piVar8->relative_version).first = local_170._24_4_;
          (piVar8->relative_version).second = local_170._28_4_;
          local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_table =
               (table_base *)
               (piVar8->generic_param_stack).
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          pvVar4 = (piVar8->generic_param_stack).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pvVar5 = (piVar8->generic_param_stack).
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (piVar8->generic_param_stack).
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               vStack_150.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (piVar8->generic_param_stack).
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               vStack_150.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (piVar8->generic_param_stack).
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               vStack_150.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          vStack_150.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_150.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_138.first.super_row_base<winmd::reader::InterfaceImpl>.m_index = (uint32_t)pvVar4;
          local_138.first.super_row_base<winmd::reader::InterfaceImpl>._12_4_ =
               SUB84((ulong)pvVar4 >> 0x20,0);
          local_138.second.super_row_base<winmd::reader::InterfaceImpl>.m_table._0_4_ = (uint)pvVar5
          ;
          local_138.second.super_row_base<winmd::reader::InterfaceImpl>.m_table._4_4_ =
               (undefined4)((ulong)pvVar5 >> 0x20);
          vStack_150.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&local_138);
        }
        if (local_188 != (table<winmd::reader::TypeSpec> *)0x0) {
          this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(*(long *)&(((table<winmd::reader::MethodDef> *)(local_188 + 3))->
                               super_table_base).m_columns._M_elems[1].size + -0x18);
          *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            **)&(((table<winmd::reader::MethodDef> *)(local_188 + 3))->super_table_base).m_columns.
                _M_elems[1].size = this;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        (ulong)(local_78.field_2._M_allocated_capacity + 1));
      }
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&vStack_150);
      uVar3._0_4_ = local_f8.super_row_base<winmd::reader::InterfaceImpl>.m_index + 1;
      local_f8.super_row_base<winmd::reader::InterfaceImpl>.m_index = (uint32_t)uVar3;
    } while ((uint32_t)uVar3 != local_e0 ||
             local_f8.super_row_base<winmd::reader::InterfaceImpl>.m_table != ptVar1);
  }
  return;
}

Assistant:

static void get_interfaces_impl(writer& w, get_interfaces_t& result, bool defaulted, bool overridable, bool base, std::vector<std::vector<std::string>> const& generic_param_stack, std::pair<InterfaceImpl, InterfaceImpl>&& children)
    {
        for (auto&& impl : children)
        {
            interface_info info;
            auto type = impl.Interface();
            auto name = w.write_temp("%", type);
            info.is_default = has_attribute(impl, "Windows.Foundation.Metadata", "DefaultAttribute");
            info.defaulted = !base && (defaulted || info.is_default);

            {
                // This is for correctness rather than an optimization (but helps performance as well).
                // If the interface was not previously inserted, carry on and recursively insert it.
                // If a previous insertion was defaulted we're done as it is correctly captured.
                // If a newly discovered instance of a previous insertion is not defaulted, we're also done.
                // If it was previously captured as non-defaulted but now found as defaulted, we carry on and
                // rediscover it as we need it to be defaulted recursively.

                if (auto found = find(result, name))
                {
                    if (found->defaulted || !info.defaulted)
                    {
                        continue;
                    }
                }
            }

            info.overridable = overridable || has_attribute(impl, "Windows.Foundation.Metadata", "OverridableAttribute");
            info.base = base;
            info.generic_param_stack = generic_param_stack;
            writer::generic_param_guard guard;

            switch (type.type())
            {
                case TypeDefOrRef::TypeDef:
                {
                    info.type = type.TypeDef();
                    break;
                }
                case TypeDefOrRef::TypeRef:
                {
                    info.type = find_required(type.TypeRef());
                    w.add_depends(info.type);
                    break;
                }
                case TypeDefOrRef::TypeSpec:
                {
                    auto type_signature = type.TypeSpec().Signature();

                    std::vector<std::string> names;

                    for (auto&& arg : type_signature.GenericTypeInst().GenericArgs())
                    {
                        names.push_back(w.write_temp("%", arg));
                    }

                    info.generic_param_stack.push_back(std::move(names));

                    guard = w.push_generic_params(type_signature.GenericTypeInst());
                    auto signature = type_signature.GenericTypeInst();
                    info.type = find_required(signature.GenericType());

                    break;
                }
            }

            info.exclusive = has_attribute(info.type, "Windows.Foundation.Metadata", "ExclusiveToAttribute");
            get_interfaces_impl(w, result, info.defaulted, info.overridable, base, info.generic_param_stack, info.type.InterfaceImpl());
            insert_or_assign(result, name, std::move(info));
        }
    }